

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Script::IsIntegerPair(Script *this,Variant *value)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  undefined1 local_58 [16];
  Variant *second;
  pointer local_40;
  Variant *first;
  undefined1 local_30 [8];
  CollectionPtr coll;
  Variant *value_local;
  Script *this_local;
  
  coll.
  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  bVar1 = Variant::IsCollection(value);
  if (bVar1) {
    Variant::GetCollection((Variant *)local_30);
    peVar2 = std::
             __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    sVar3 = std::
            map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
            ::size(peVar2);
    if (sVar3 == 2) {
      peVar2 = std::
               __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      second = (Variant *)
               std::
               map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
               ::begin(peVar2);
      local_40 = std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_> *)
                            &second);
      std::
      __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_30);
      std::
      map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
      ::rbegin((map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
                *)local_58);
      local_58._8_8_ =
           std::
           reverse_iterator<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
           ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
                         *)local_58);
      bVar1 = Variant::IsInteger(&local_40->first);
      if ((bVar1) && (bVar1 = Variant::IsInteger((Variant *)local_58._8_8_), bVar1)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    first._4_4_ = 1;
    std::
    shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                   *)local_30);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline_t bool Script::IsIntegerPair(const Variant & value) const
	{
		if (!value.IsCollection())
			return false;
		auto coll = value.GetCollection();
		if (coll->size() != 2)
			return false;
		const auto & first = coll->begin()->first;
		const auto & second = coll->rbegin()->first;
		if (!first.IsInteger() || !second.IsInteger())
			return false;
		return true;
	}